

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxIn::SetIssuance
          (ConfidentialTxIn *this,ByteData256 *blinding_nonce,ByteData256 *asset_entropy,
          ConfidentialValue *issuance_amount,ConfidentialValue *inflation_keys,
          ByteData *issuance_amount_rangeproof,ByteData *inflation_keys_rangeproof)

{
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->blinding_nonce_,
             &blinding_nonce->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->asset_entropy_,
             &asset_entropy->data_);
  if (&this->issuance_amount_ != issuance_amount) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(this->issuance_amount_).data_,&(issuance_amount->data_).data_);
    (this->issuance_amount_).version_ = issuance_amount->version_;
  }
  if (&this->inflation_keys_ != inflation_keys) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(this->inflation_keys_).data_,&(inflation_keys->data_).data_);
    (this->inflation_keys_).version_ = inflation_keys->version_;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &this->issuance_amount_rangeproof_,&issuance_amount_rangeproof->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &this->inflation_keys_rangeproof_,&inflation_keys_rangeproof->data_);
  return;
}

Assistant:

void ConfidentialTxIn::SetIssuance(
    const ByteData256 &blinding_nonce, const ByteData256 &asset_entropy,
    const ConfidentialValue &issuance_amount,
    const ConfidentialValue &inflation_keys,
    const ByteData &issuance_amount_rangeproof,
    const ByteData &inflation_keys_rangeproof) {
  blinding_nonce_ = blinding_nonce;
  asset_entropy_ = asset_entropy;
  issuance_amount_ = issuance_amount;
  inflation_keys_ = inflation_keys;
  issuance_amount_rangeproof_ = issuance_amount_rangeproof;
  inflation_keys_rangeproof_ = inflation_keys_rangeproof;
}